

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<float>::erase(RepeatedField<float> *this,const_iterator position)

{
  iterator pfVar1;
  const_iterator position_local;
  RepeatedField<float> *this_local;
  
  pfVar1 = erase(this,position,position + 1);
  return pfVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}